

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_module.cpp
# Opt level: O0

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::BuildModule
          (spvtools *this,spv_target_env env,MessageConsumer *consumer,uint32_t *binary,size_t size)

{
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_50;
  size_t local_30;
  size_t size_local;
  uint32_t *binary_local;
  MessageConsumer *consumer_local;
  spvtools *psStack_10;
  spv_target_env env_local;
  
  local_30 = size;
  size_local = (size_t)binary;
  binary_local = (uint32_t *)consumer;
  consumer_local._4_4_ = env;
  psStack_10 = this;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_50,consumer);
  BuildModule(this,env,&local_50,(uint32_t *)size_local,local_30,true);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_50);
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opt::IRContext> BuildModule(spv_target_env env,
                                            MessageConsumer consumer,
                                            const uint32_t* binary,
                                            const size_t size) {
  return BuildModule(env, consumer, binary, size, true);
}